

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTargetInternals::cmTargetInternals(cmTargetInternals *this)

{
  static_string_view propertyName;
  FileSetEntries local_2e0;
  string_view local_2b8;
  FileSetEntries local_2a8;
  string_view local_280;
  string_view local_270;
  string_view local_260;
  string_view local_250;
  string_view local_240;
  string_view local_230;
  string_view local_220;
  string_view local_210;
  string_view local_200;
  FileSetEntries local_1f0;
  string_view local_1c8;
  FileSetEntries local_1b8;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  string_view local_160;
  string_view local_150;
  string_view local_140;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  FileSetEntries local_100;
  string_view local_d8;
  FileSetEntries local_c8;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  cmTargetInternals *local_10;
  cmTargetInternals *this_local;
  
  local_10 = this;
  cmPolicies::PolicyMap::PolicyMap(&this->PolicyMap);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->InstallPath);
  std::__cxx11::string::string((string *)&this->RuntimeInstallPath);
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  ::set(&this->Utilities);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreBuildCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreLinkCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PostBuildCommands);
  std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
            (&this->InstallGenerators);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->OriginalLinkLibraries);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map(&this->LanguageStandardProperties);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->IncludeDirectoriesEntries);
  std::
  map<const_cmTargetExport_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmTargetExport_*>,_std::allocator<std::pair<const_cmTargetExport_*const,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->InstallIncludeDirectoriesEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->CompileOptionsEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->CompileFeaturesEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->CompileDefinitionsEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->PrecompileHeadersEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->SourceEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->LinkOptionsEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->LinkDirectoriesEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->LinkImplementationPropertyEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->LinkInterfacePropertyEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->LinkInterfaceDirectPropertyEntries);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->LinkInterfaceDirectExcludePropertyEntries);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::vector(&this->TLLCommands);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
  ::map(&this->FileSets);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  local_30 = (string_view)::cm::operator____s("HEADERS",7);
  local_40 = (string_view)::cm::operator____s("HEADER_DIRS",0xb);
  local_50 = (string_view)::cm::operator____s("HEADER_SET",10);
  local_60 = (string_view)::cm::operator____s("HEADER_DIRS_",0xc);
  local_70 = (string_view)::cm::operator____s("HEADER_SET_",0xb);
  local_80 = (string_view)::cm::operator____s("Header",6);
  local_90 = (string_view)::cm::operator____s("The default header set",0x16);
  local_a0 = (string_view)::cm::operator____s("Header set",10);
  local_d8 = (string_view)::cm::operator____s("HEADER_SETS",0xb);
  anon_unknown.dwarf_831db9::FileSetEntries::FileSetEntries(&local_c8,(static_string_view)local_d8);
  local_110 = (string_view)::cm::operator____s("INTERFACE_HEADER_SETS",0x15);
  anon_unknown.dwarf_831db9::FileSetEntries::FileSetEntries
            (&local_100,(static_string_view)local_110);
  anon_unknown.dwarf_831db9::FileSetType::FileSetType
            (&this->HeadersFileSets,(static_string_view)local_30,(static_string_view)local_40,
             (static_string_view)local_50,(static_string_view)local_60,(static_string_view)local_70,
             (static_string_view)local_80,(static_string_view)local_90,(static_string_view)local_a0,
             &local_c8,&local_100);
  anon_unknown.dwarf_831db9::FileSetEntries::~FileSetEntries(&local_100);
  anon_unknown.dwarf_831db9::FileSetEntries::~FileSetEntries(&local_c8);
  local_120 = (string_view)::cm::operator____s("CXX_MODULES",0xb);
  local_130 = (string_view)::cm::operator____s("CXX_MODULE_DIRS",0xf);
  local_140 = (string_view)::cm::operator____s("CXX_MODULE_SET",0xe);
  local_150 = (string_view)::cm::operator____s("CXX_MODULE_DIRS_",0x10);
  local_160 = (string_view)::cm::operator____s("CXX_MODULE_SET_",0xf);
  local_170 = (string_view)::cm::operator____s("C++ module",10);
  local_180 = (string_view)::cm::operator____s("The default C++ module set",0x1a);
  local_190 = (string_view)::cm::operator____s("C++ module set",0xe);
  local_1c8 = (string_view)::cm::operator____s("CXX_MODULE_SETS",0xf);
  anon_unknown.dwarf_831db9::FileSetEntries::FileSetEntries
            (&local_1b8,(static_string_view)local_1c8);
  local_200 = (string_view)::cm::operator____s("INTERFACE_CXX_MODULE_SETS",0x19);
  anon_unknown.dwarf_831db9::FileSetEntries::FileSetEntries
            (&local_1f0,(static_string_view)local_200);
  anon_unknown.dwarf_831db9::FileSetType::FileSetType
            (&this->CxxModulesFileSets,(static_string_view)local_120,(static_string_view)local_130,
             (static_string_view)local_140,(static_string_view)local_150,
             (static_string_view)local_160,(static_string_view)local_170,
             (static_string_view)local_180,(static_string_view)local_190,&local_1b8,&local_1f0);
  anon_unknown.dwarf_831db9::FileSetEntries::~FileSetEntries(&local_1f0);
  anon_unknown.dwarf_831db9::FileSetEntries::~FileSetEntries(&local_1b8);
  local_210 = (string_view)::cm::operator____s("CXX_MODULE_HEADER_UNITS",0x17);
  local_220 = (string_view)::cm::operator____s("CXX_MODULE_HEADER_UNIT_DIRS",0x1b);
  local_230 = (string_view)::cm::operator____s("CXX_MODULE_HEADER_UNIT_SET",0x1a);
  local_240 = (string_view)::cm::operator____s("CXX_MODULE_HEADER_UNIT_DIRS_",0x1c);
  local_250 = (string_view)::cm::operator____s("CXX_MODULE_HEADER_UNIT_SET_",0x1b);
  local_260 = (string_view)::cm::operator____s("C++ module header",0x11);
  local_270 = (string_view)::cm::operator____s("The default C++ module header set",0x21);
  local_280 = (string_view)::cm::operator____s("C++ module header set",0x15);
  local_2b8 = (string_view)::cm::operator____s("CXX_MODULE_HEADER_UNIT_SETS",0x1b);
  anon_unknown.dwarf_831db9::FileSetEntries::FileSetEntries
            (&local_2a8,(static_string_view)local_2b8);
  propertyName = ::cm::operator____s("INTERFACE_CXX_MODULE_HEADER_UNIT_SETS",0x25);
  anon_unknown.dwarf_831db9::FileSetEntries::FileSetEntries(&local_2e0,propertyName);
  anon_unknown.dwarf_831db9::FileSetType::FileSetType
            (&this->CxxModuleHeadersFileSets,(static_string_view)local_210,
             (static_string_view)local_220,(static_string_view)local_230,
             (static_string_view)local_240,(static_string_view)local_250,
             (static_string_view)local_260,(static_string_view)local_270,
             (static_string_view)local_280,&local_2a8,&local_2e0);
  anon_unknown.dwarf_831db9::FileSetEntries::~FileSetEntries(&local_2e0);
  anon_unknown.dwarf_831db9::FileSetEntries::~FileSetEntries(&local_2a8);
  return;
}

Assistant:

cmTargetInternals::cmTargetInternals()
  : HeadersFileSets("HEADERS"_s, "HEADER_DIRS"_s, "HEADER_SET"_s,
                    "HEADER_DIRS_"_s, "HEADER_SET_"_s, "Header"_s,
                    "The default header set"_s, "Header set"_s,
                    FileSetEntries("HEADER_SETS"_s),
                    FileSetEntries("INTERFACE_HEADER_SETS"_s))
  , CxxModulesFileSets("CXX_MODULES"_s, "CXX_MODULE_DIRS"_s,
                       "CXX_MODULE_SET"_s, "CXX_MODULE_DIRS_"_s,
                       "CXX_MODULE_SET_"_s, "C++ module"_s,
                       "The default C++ module set"_s, "C++ module set"_s,
                       FileSetEntries("CXX_MODULE_SETS"_s),
                       FileSetEntries("INTERFACE_CXX_MODULE_SETS"_s))
  , CxxModuleHeadersFileSets(
      "CXX_MODULE_HEADER_UNITS"_s, "CXX_MODULE_HEADER_UNIT_DIRS"_s,
      "CXX_MODULE_HEADER_UNIT_SET"_s, "CXX_MODULE_HEADER_UNIT_DIRS_"_s,
      "CXX_MODULE_HEADER_UNIT_SET_"_s, "C++ module header"_s,
      "The default C++ module header set"_s, "C++ module header set"_s,
      FileSetEntries("CXX_MODULE_HEADER_UNIT_SETS"_s),
      FileSetEntries("INTERFACE_CXX_MODULE_HEADER_UNIT_SETS"_s))
{
}